

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::FunctionBody::RecordStatementMap(FunctionBody *this,StatementMap *pStatementMap)

{
  Recycler *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_01;
  Recycler *alloc;
  undefined1 local_58 [8];
  TrackAllocData data;
  StatementMap *pStatementMap_local;
  
  data._32_8_ = pStatementMap;
  if ((this->m_sourceInfo).pSpanSequence != (Type)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x114,"(!this->m_sourceInfo.pSpanSequence)",
                                "!this->m_sourceInfo.pSpanSequence");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this_00 = ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->recycler;
  this_01 = (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)FunctionProxy::GetAuxPtrWithLock((FunctionProxy *)this,StatementMaps);
  if (this_01 ==
      (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    local_58 = (undefined1  [8])
               &JsUtil::
                List<Js::FunctionBody::StatementMap*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>
                ::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_2ab02c8;
    data.filename._0_4_ = 0x119;
    alloc = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_58);
    this_01 = (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               *)new<Memory::Recycler>(0x30,alloc,0x387914);
    (this_01->
    super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>).alloc =
         this_00;
    (this_01->
    super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>).
    _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014db048;
    (this_01->
    super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>).buffer.
    ptr = (WriteBarrierPtr<Js::FunctionBody::StatementMap> *)0x0;
    (this_01->
    super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>).count =
         0;
    this_01->length = 0;
    this_01->increment = 4;
    FunctionProxy::SetAuxPtr((FunctionProxy *)this,StatementMaps,this_01);
  }
  JsUtil::
  List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::Add(this_01,(StatementMap **)&data.line);
  return;
}

Assistant:

void
    FunctionBody::RecordStatementMap(StatementMap* pStatementMap)
    {
        Assert(!this->m_sourceInfo.pSpanSequence);
        Recycler* recycler = this->m_scriptContext->GetRecycler();
        StatementMapList * statementMaps = this->GetStatementMaps();
        if (!statementMaps)
        {
            statementMaps = RecyclerNew(recycler, StatementMapList, recycler);
            this->SetStatementMaps(statementMaps);
        }

        statementMaps->Add(pStatementMap);
    }